

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::rescalePartialsByPartition
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,double *scaleFactors,
          double *cumulativeScaleFactors,int fillWithOnes,int partitionIndex)

{
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  undefined8 uVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  uint local_38;
  undefined1 auVar18 [64];
  
  piVar4 = (this->super_BeagleCPUImpl<double,_1,_0>).gPatternPartitionsStartPatterns;
  iVar15 = piVar4[partitionIndex];
  lVar14 = (long)iVar15;
  iVar3 = piVar4[(long)partitionIndex + 1];
  if (iVar15 < iVar3) {
    lVar5 = (this->super_BeagleCPUImpl<double,_1,_0>).kFlags;
    iVar15 = iVar15 * 4;
    do {
      iVar11 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
      auVar17 = ZEXT816(0) << 0x40;
      auVar18 = ZEXT864(0) << 0x40;
      if (0 < iVar11) {
        iVar12 = iVar11;
        iVar13 = iVar15;
        do {
          auVar17._8_8_ = 0;
          auVar17._0_8_ = destP[iVar13];
          auVar17 = vmaxsd_avx(auVar17,auVar18._0_16_);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = destP[(long)iVar13 + 1];
          auVar17 = vmaxsd_avx(auVar20,auVar17);
          auVar21._8_8_ = 0;
          auVar21._0_8_ = destP[(long)iVar13 + 2];
          auVar17 = vmaxsd_avx(auVar21,auVar17);
          auVar22._8_8_ = 0;
          auVar22._0_8_ = destP[(long)iVar13 + 3];
          auVar17 = vmaxsd_avx(auVar22,auVar17);
          auVar18 = ZEXT1664(auVar17);
          iVar13 = iVar13 + (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount * 4;
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
      }
      uVar6 = vcmpsd_avx512f(auVar17,ZEXT816(0),0);
      bVar7 = (bool)((byte)uVar6 & 1);
      dVar16 = (double)((ulong)bVar7 * 0x3ff0000000000000 + (ulong)!bVar7 * auVar17._0_8_);
      if (0 < iVar11) {
        dVar19 = 1.0 / dVar16;
        iVar13 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
        iVar12 = iVar15;
        do {
          pdVar1 = destP + iVar12;
          dVar8 = pdVar1[1];
          dVar9 = pdVar1[2];
          dVar10 = pdVar1[3];
          pdVar2 = destP + iVar12;
          *pdVar2 = dVar19 * *pdVar1;
          pdVar2[1] = dVar19 * dVar8;
          pdVar2[2] = dVar19 * dVar9;
          pdVar2[3] = dVar19 * dVar10;
          iVar12 = iVar12 + iVar13 * 4;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      local_38 = (uint)lVar5;
      if ((local_38 >> 10 & 1) == 0) {
        scaleFactors[lVar14] = dVar16;
        if (cumulativeScaleFactors != (double *)0x0) {
          dVar16 = log(dVar16);
LAB_001290d7:
          cumulativeScaleFactors[lVar14] = dVar16 + cumulativeScaleFactors[lVar14];
        }
      }
      else {
        dVar16 = log(dVar16);
        scaleFactors[lVar14] = dVar16;
        if (cumulativeScaleFactors != (double *)0x0) goto LAB_001290d7;
      }
      lVar14 = lVar14 + 1;
      iVar15 = iVar15 + 4;
    } while (lVar14 != iVar3);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::rescalePartialsByPartition(
                                                                    REALTYPE* destP,
                                                                    REALTYPE* scaleFactors,
                                                                    REALTYPE* cumulativeScaleFactors,
                                                                    const int fillWithOnes,
                                                                    const int partitionIndex) {

    bool useLogScalars = kFlags & BEAGLE_FLAG_SCALERS_LOG;

    int startPattern = gPatternPartitionsStartPatterns[partitionIndex];
    int endPattern = gPatternPartitionsStartPatterns[partitionIndex + 1];

    for (int k = startPattern; k < endPattern; k++) {
      REALTYPE max = 0;
        const int patternOffset = k * 4;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;

#ifdef BEAGLE_TEST_OPTIMIZATION
            REALTYPE max01 = FAST_MAX(destP[offset + 0], destP[offset + 1]);
            REALTYPE max23 = FAST_MAX(destP[offset + 2], destP[offset + 3]);
            max = FAST_MAX(max, max01);
            max = FAST_MAX(max, max23);
#else
      #pragma unroll
            for (int i = 0; i < 4; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
#endif
        }

        if (max == 0)
            max = REALTYPE(1.0);

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;
      #pragma unroll
            for (int i = 0; i < 4; i++)
                destP[offset++] *= oneOverMax;
        }

        if (useLogScalars) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
}